

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O3

bool __thiscall draco::ObjEncoder::EncodeSubObject(ObjEncoder *this,FaceIndex face_id)

{
  PointAttribute *this_00;
  EncoderBuffer *pEVar1;
  bool bVar2;
  uint in_EAX;
  iterator iVar3;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> att_id;
  int sub_obj_id;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this_00 = this->sub_obj_att_;
  att_id.value_ =
       (this->in_mesh_->faces_).vector_.
       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start[face_id.value_]._M_elems[0].value_;
  if (this_00->identity_mapping_ == false) {
    att_id.value_ =
         (this_00->indices_map_).vector_.
         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[att_id.value_].value_;
  }
  bVar2 = GeometryAttribute::ConvertValue<int>
                    (&this_00->super_GeometryAttribute,(AttributeValueIndex)att_id.value_,
                     (this_00->super_GeometryAttribute).num_components_,
                     (int *)((long)&uStack_18 + 4));
  if (bVar2) {
    if (uStack_18._4_4_ == this->current_sub_obj_id_) {
      return true;
    }
    pEVar1 = this->out_buffer_;
    if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar1,
                 (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,"o ","");
    }
    iVar3 = std::
            _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->sub_obj_id_to_name_)._M_h,(key_type *)((long)&uStack_18 + 4));
    if (iVar3.
        super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pEVar1 = this->out_buffer_;
      if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar1,
                   (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(long *)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                   ._M_cur + 0x10),
                   *(long *)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                   ._M_cur + 0x18) +
                   *(long *)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                   ._M_cur + 0x10));
        pEVar1 = this->out_buffer_;
        if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar1,
                     (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,"\n","");
        }
      }
      this->current_sub_obj_id_ = uStack_18._4_4_;
      return true;
    }
  }
  return false;
}

Assistant:

bool ObjEncoder::EncodeSubObject(FaceIndex face_id) {
  int sub_obj_id = 0;
  // Pick the first corner, all corners of a face should have same id.
  const PointIndex vert_index = in_mesh_->face(face_id)[0];
  const AttributeValueIndex index_id(sub_obj_att_->mapped_index(vert_index));
  if (!sub_obj_att_->ConvertValue<int>(index_id, &sub_obj_id)) {
    return false;
  }
  if (sub_obj_id != current_sub_obj_id_) {
    buffer()->Encode("o ", 2);
    const auto sub_obj_ptr = sub_obj_id_to_name_.find(sub_obj_id);
    if (sub_obj_ptr == sub_obj_id_to_name_.end()) {
      return false;
    }
    buffer()->Encode(sub_obj_ptr->second.c_str(), sub_obj_ptr->second.size());
    buffer()->Encode("\n", 1);
    current_sub_obj_id_ = sub_obj_id;
  }
  return true;
}